

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::NewKey
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this,
          FString *key)

{
  hash_t hVar1;
  Node *pNVar2;
  char *pcVar3;
  undefined4 uVar4;
  DWORD DVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  FString local_48;
  FString local_40;
  FString local_38;
  
  FString::AttachToOther(&local_38,key);
  pNVar6 = this->Nodes;
  DVar5 = SuperFastHash(local_38.Chars,(ulong)*(uint *)(local_38.Chars + -0xc));
  pNVar6 = pNVar6 + (this->Size - 1 & DVar5);
  FString::~FString(&local_38);
  if (pNVar6->Next != (Node *)0x1) {
    pNVar7 = this->LastFree;
    do {
      pNVar8 = pNVar7;
      pNVar7 = pNVar8 + -1;
      if (pNVar8 <= this->Nodes) {
        this->LastFree = pNVar7;
        Resize(this,this->Size * 2);
        FString::AttachToOther(&local_40,key);
        pNVar6 = NewKey(this,&local_40);
        FString::~FString(&local_40);
        return pNVar6;
      }
    } while (pNVar7->Next != (Node *)0x1);
    this->LastFree = pNVar7;
    FString::AttachToOther(&local_48,&(pNVar6->Pair).Key);
    pNVar9 = this->Nodes;
    DVar5 = SuperFastHash(local_48.Chars,(ulong)*(uint *)(local_48.Chars + -0xc));
    hVar1 = this->Size;
    FString::~FString(&local_48);
    pNVar2 = pNVar9 + (hVar1 - 1 & DVar5);
    if (pNVar9 + (hVar1 - 1 & DVar5) == pNVar6) {
      pNVar7->Next = pNVar6->Next;
      pNVar8 = pNVar7;
      goto LAB_0044eb30;
    }
    do {
      pNVar9 = pNVar2;
      pNVar2 = pNVar9->Next;
    } while (pNVar2 != pNVar6);
    pNVar9->Next = pNVar7;
    uVar4 = *(undefined4 *)&(pNVar6->Pair).field_0xc;
    pNVar8[-1].Pair.Value = (FMissingCount)(pNVar6->Pair).Value.Count;
    *(undefined4 *)&pNVar8[-1].Pair.field_0xc = uVar4;
    pcVar3 = (pNVar6->Pair).Key.Chars;
    pNVar7->Next = pNVar6->Next;
    pNVar8[-1].Pair.Key.Chars = pcVar3;
  }
  pNVar7 = (Node *)0x0;
  pNVar8 = pNVar6;
LAB_0044eb30:
  pNVar6->Next = pNVar7;
  this->NumUsed = this->NumUsed + 1;
  FString::AttachToOther(&(pNVar8->Pair).Key,key);
  return pNVar8;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}